

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::CopyPropagateArrays::BuildNewAccessChain
          (CopyPropagateArrays *this,Instruction *insertion_point,MemoryObject *source)

{
  Analysis preserved_analyses;
  uint32_t type_id;
  uint32_t base_ptr_id;
  IRContext *context;
  vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
  *pvVar1;
  size_type sVar2;
  Instruction *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  uint *local_90;
  uint *local_80;
  AccessChainEntry *local_78;
  AccessChainEntry *local_70;
  allocator<unsigned_int> local_61;
  undefined1 local_60 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> access_ids;
  InstructionBuilder builder;
  MemoryObject *source_local;
  Instruction *insertion_point_local;
  CopyPropagateArrays *this_local;
  
  context = Pass::context((Pass *)this);
  preserved_analyses = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)
             &access_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,context,insertion_point,preserved_analyses);
  pvVar1 = MemoryObject::AccessChain(source);
  sVar2 = std::
          vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
          ::size(pvVar1);
  if (sVar2 == 0) {
    this_local = (CopyPropagateArrays *)MemoryObject::GetVariable(source);
  }
  else {
    MemoryObject::BuildConstants(source);
    pvVar1 = MemoryObject::AccessChain(source);
    sVar2 = std::
            vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
            ::size(pvVar1);
    std::allocator<unsigned_int>::allocator(&local_61);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,sVar2,&local_61);
    std::allocator<unsigned_int>::~allocator(&local_61);
    pvVar1 = MemoryObject::AccessChain(source);
    local_70 = (AccessChainEntry *)
               std::
               vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
               ::cbegin(pvVar1);
    pvVar1 = MemoryObject::AccessChain(source);
    local_78 = (AccessChainEntry *)
               std::
               vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
               ::cend(pvVar1);
    local_80 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
    local_90 = (uint *)std::
                       transform<__gnu_cxx::__normal_iterator<spvtools::opt::CopyPropagateArrays::AccessChainEntry_const*,std::vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,spvtools::opt::CopyPropagateArrays::BuildNewAccessChain(spvtools::opt::Instruction*,spvtools::opt::CopyPropagateArrays::MemoryObject*)const::__0>
                                 (local_70,local_78,local_80);
    type_id = MemoryObject::GetPointerTypeId(source,this);
    this_00 = MemoryObject::GetVariable(source);
    base_ptr_id = Instruction::result_id(this_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_a8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
    this_local = (CopyPropagateArrays *)
                 InstructionBuilder::AddAccessChain
                           ((InstructionBuilder *)
                            &access_ids.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,type_id,base_ptr_id,
                            &local_a8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_a8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  }
  return (Instruction *)this_local;
}

Assistant:

Instruction* CopyPropagateArrays::BuildNewAccessChain(
    Instruction* insertion_point,
    CopyPropagateArrays::MemoryObject* source) const {
  InstructionBuilder builder(
      context(), insertion_point,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  if (source->AccessChain().size() == 0) {
    return source->GetVariable();
  }

  source->BuildConstants();
  std::vector<uint32_t> access_ids(source->AccessChain().size());
  std::transform(
      source->AccessChain().cbegin(), source->AccessChain().cend(),
      access_ids.begin(), [](const AccessChainEntry& entry) {
        assert(entry.is_result_id && "Constants needs to be built first.");
        return entry.result_id;
      });

  return builder.AddAccessChain(source->GetPointerTypeId(this),
                                source->GetVariable()->result_id(), access_ids);
}